

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::portmap_alert::portmap_alert
          (portmap_alert *this,stack_allocator *param_1,port_mapping_t i,int port,
          portmap_transport t,portmap_protocol proto)

{
  portmap_protocol proto_local;
  portmap_transport t_local;
  int port_local;
  stack_allocator *param_1_local;
  portmap_alert *this_local;
  port_mapping_t i_local;
  
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__portmap_alert_009911b0;
  (this->mapping).m_val = i.m_val;
  this->external_port = port;
  this->map_protocol = proto;
  this->map_transport = t;
  this->protocol = (uint)proto;
  this->map_type = (uint)t;
  return;
}

Assistant:

portmap_alert::portmap_alert(aux::stack_allocator&, port_mapping_t const i
		, int port
		, portmap_transport const t
		, portmap_protocol const proto)
		: mapping(i)
		, external_port(port)
		, map_protocol(proto)
		, map_transport(t)
#if TORRENT_ABI_VERSION == 1
		, protocol(static_cast<int>(proto))
		, map_type(static_cast<int>(t))
#endif
	{}